

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QSize __thiscall
QDockAreaLayout::size_helper<QSize(QDockAreaLayoutInfo::*)()const,QSize(QLayoutItem::*)()const>
          (QDockAreaLayout *this,offset_in_QDockAreaLayoutInfo_to_subr sizeFn,
          offset_in_QLayoutItem_to_subr centerFn)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  code *in_RCX;
  int iVar8;
  int iVar9;
  Representation RVar10;
  QSize QVar11;
  int iVar12;
  Representation RVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  long *plVar18;
  QLayoutItem *pQVar19;
  int iVar20;
  long in_R8;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  int local_5c;
  undefined8 local_58;
  int local_50;
  undefined8 local_40;
  
  if (this->centralWidgetItem == (QLayoutItem *)0x0) {
    iVar12 = 0;
    iVar22 = 0;
    local_5c = 0;
    iVar9 = 0;
  }
  else {
    uVar24 = 0xffffffffffffffff;
    lVar17 = 0;
    do {
      uVar24 = uVar24 + 1;
      uVar1 = this->docks[0].item_list.d.size;
      if (uVar1 <= uVar24) break;
      bVar3 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar17));
      lVar17 = lVar17 + 0x28;
    } while (bVar3);
    iVar9 = 0;
    if (uVar24 < uVar1) {
      iVar9 = this->sep;
    }
    uVar24 = 0xffffffffffffffff;
    lVar17 = 0;
    do {
      uVar24 = uVar24 + 1;
      uVar1 = this->docks[1].item_list.d.size;
      if (uVar1 <= uVar24) break;
      bVar3 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar17));
      lVar17 = lVar17 + 0x28;
    } while (bVar3);
    local_5c = 0;
    if (uVar24 < uVar1) {
      local_5c = this->sep;
    }
    uVar24 = 0xffffffffffffffff;
    lVar17 = 0;
    do {
      uVar24 = uVar24 + 1;
      uVar1 = this->docks[2].item_list.d.size;
      if (uVar1 <= uVar24) break;
      bVar3 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[2].item_list.d.ptr)->widgetItem + lVar17));
      lVar17 = lVar17 + 0x28;
    } while (bVar3);
    iVar12 = 0;
    if (uVar24 < uVar1) {
      iVar12 = this->sep;
    }
    uVar24 = 0xffffffffffffffff;
    lVar17 = 0;
    do {
      uVar24 = uVar24 + 1;
      uVar1 = this->docks[3].item_list.d.size;
      if (uVar1 <= uVar24) break;
      bVar3 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[3].item_list.d.ptr)->widgetItem + lVar17));
      lVar17 = lVar17 + 0x28;
    } while (bVar3);
    iVar22 = 0;
    if (uVar24 < uVar1) {
      iVar22 = this->sep;
    }
  }
  if ((sizeFn & 1) == 0) {
    local_58 = (*(code *)sizeFn)();
    uVar4 = (*(code *)sizeFn)((long)&this->docks[1].sep + centerFn);
    local_40 = (*(code *)sizeFn)((long)&this->docks[2].sep + centerFn);
    plVar18 = (long *)((long)&this->docks[3].sep + centerFn);
  }
  else {
    plVar18 = (long *)((long)&this->docks[1].sep + centerFn);
    local_58 = (**(code **)(*(long *)((long)&this->docks[0].sep + centerFn) + -1 + sizeFn))
                         ((long)&this->docks[0].sep + centerFn);
    uVar4 = (**(code **)(*plVar18 + -1 + sizeFn))(plVar18);
    local_40 = (**(code **)(*(long *)((long)&this->docks[2].sep + centerFn) + -1 + sizeFn))();
    plVar18 = (long *)((long)&this->docks[3].sep + centerFn);
    sizeFn = *(undefined8 *)(*plVar18 + -1 + sizeFn);
  }
  uVar5 = (*(code *)sizeFn)(plVar18);
  pQVar19 = this->centralWidgetItem;
  iVar23 = 0;
  iVar16 = 0;
  iVar7 = 0;
  uVar6 = 0;
  if (pQVar19 != (QLayoutItem *)0x0) {
    pQVar19 = (QLayoutItem *)((long)&pQVar19->_vptr_QLayoutItem + in_R8);
    if (((ulong)in_RCX & 1) != 0) {
      in_RCX = *(code **)(in_RCX + (long)pQVar19->_vptr_QLayoutItem + -1);
    }
    uVar6 = (*in_RCX)();
    iVar7 = (int)((ulong)uVar6 >> 0x20);
  }
  iVar22 = iVar22 + (int)((ulong)uVar5 >> 0x20);
  iVar12 = iVar12 + (int)((ulong)local_40 >> 0x20);
  local_5c = local_5c + (int)uVar4;
  iVar9 = iVar9 + (int)local_58;
  auVar25._0_4_ = -(uint)(this->corners[0] == LeftDockWidgetArea);
  auVar25._4_4_ = -(uint)(this->corners[1] == RightDockWidgetArea);
  auVar25._8_4_ = -(uint)(this->corners[2] == LeftDockWidgetArea);
  auVar25._12_4_ = -(uint)(this->corners[3] == RightDockWidgetArea);
  uVar15 = movmskps((int)pQVar19,auVar25);
  iVar20 = iVar12;
  iVar2 = 0;
  if ((uVar15 & 1) != 0) {
    iVar20 = iVar16;
    iVar2 = iVar9;
  }
  iVar21 = iVar12;
  iVar8 = 0;
  if ((uVar15 & 2) != 0) {
    iVar21 = iVar16;
    iVar8 = local_5c;
  }
  iVar8 = iVar8 + iVar2 + (int)local_40;
  iVar14 = iVar22;
  iVar2 = 0;
  if ((uVar15 & 4) != 0) {
    iVar14 = iVar16;
    iVar2 = iVar9;
  }
  local_50 = (int)uVar5;
  iVar14 = iVar14 + iVar20 + (int)((ulong)local_58 >> 0x20);
  iVar16 = local_5c;
  if ((uVar15 & 8) == 0) {
    iVar23 = iVar22;
    iVar16 = 0;
  }
  iVar16 = iVar16 + iVar2 + local_50;
  iVar23 = iVar23 + iVar21 + (int)((ulong)uVar4 >> 0x20);
  RVar13.m_i = iVar12 + iVar7 + iVar22;
  RVar10.m_i = iVar9 + local_5c + (int)uVar6;
  if (RVar10.m_i <= iVar16) {
    RVar10.m_i = iVar16;
  }
  if (RVar10.m_i <= iVar8) {
    RVar10.m_i = iVar8;
  }
  if (RVar13.m_i <= iVar23) {
    RVar13.m_i = iVar23;
  }
  if (RVar13.m_i <= iVar14) {
    RVar13.m_i = iVar14;
  }
  QVar11.ht.m_i = RVar13.m_i;
  QVar11.wd.m_i = RVar10.m_i;
  return QVar11;
}

Assistant:

QSize QDockAreaLayout::size_helper(SizePMF sizeFn, CenterPMF centerFn) const
{
    int left_sep = 0;
    int right_sep = 0;
    int top_sep = 0;
    int bottom_sep = 0;

    if (centralWidgetItem != nullptr) {
        left_sep = docks[QInternal::LeftDock].isEmpty() ? 0 : sep;
        right_sep = docks[QInternal::RightDock].isEmpty() ? 0 : sep;
        top_sep = docks[QInternal::TopDock].isEmpty() ? 0 : sep;
        bottom_sep = docks[QInternal::BottomDock].isEmpty() ? 0 : sep;
    }

    const QSize left = (docks[QInternal::LeftDock].*sizeFn)() + QSize(left_sep, 0);
    const QSize right = (docks[QInternal::RightDock].*sizeFn)() + QSize(right_sep, 0);
    const QSize top = (docks[QInternal::TopDock].*sizeFn)() + QSize(0, top_sep);
    const QSize bottom = (docks[QInternal::BottomDock].*sizeFn)() + QSize(0, bottom_sep);
    const QSize center = centralWidgetItem == nullptr
                       ? QSize(0, 0) : (centralWidgetItem->*centerFn)();

    int row1 = top.width();
    int row2 = left.width() + center.width() + right.width();
    int row3 = bottom.width();
    int col1 = left.height();
    int col2 = top.height() + center.height() + bottom.height();
    int col3 = right.height();

    if (corners[Qt::TopLeftCorner] == Qt::LeftDockWidgetArea)
        row1 += left.width();
    else
        col1 += top.height();

    if (corners[Qt::TopRightCorner] == Qt::RightDockWidgetArea)
        row1 += right.width();
    else
        col3 += top.height();

    if (corners[Qt::BottomLeftCorner] == Qt::LeftDockWidgetArea)
        row3 += left.width();
    else
        col1 += bottom.height();

    if (corners[Qt::BottomRightCorner] == Qt::RightDockWidgetArea)
        row3 += right.width();
    else
        col3 += bottom.height();

    return QSize(qMax(row1, row2, row3), qMax(col1, col2, col3));
}